

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void rename_regs(MIR_context_t ctx,MIR_func_t func,MIR_func_t called_func,VARR_MIR_var_t *vars,
                size_t nvars)

{
  char cVar1;
  MIR_type_t MVar2;
  uint reg;
  VARR_char *pVVar3;
  size_t sVar4;
  MIR_var_t *pMVar5;
  VARR_MIR_reg_t *pVVar6;
  MIR_reg_t MVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  size_t sVar11;
  reg_desc_t *prVar12;
  long lVar13;
  MIR_context_t __ptr;
  ulong uVar14;
  char *name;
  simplify_ctx *psVar15;
  MIR_context_t __ptr_00;
  char *hard_reg_name;
  MIR_context_t unaff_R12;
  long lVar16;
  MIR_type_t type;
  char buff [50];
  char local_68 [56];
  
  if (nvars == 0 || vars == (VARR_MIR_var_t *)0x0) {
    return;
  }
  uVar14 = 0;
LAB_0014310b:
  pVVar3 = ctx->temp_string;
  if ((pVVar3 == (VARR_char *)0x0) || (pVVar3->varr == (char *)0x0)) {
LAB_00143379:
    rename_regs_cold_9();
LAB_0014337e:
    rename_regs_cold_7();
LAB_00143383:
    rename_regs_cold_8();
LAB_00143388:
    pcVar10 = "undeclared func reg %s";
    __ptr_00 = (MIR_context_t)0xf;
    (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared func reg %s",unaff_R12);
LAB_0014339d:
    rename_regs_cold_6();
    goto LAB_001433a2;
  }
  pVVar3->els_num = 0;
  sprintf(local_68,".c%d_",(ulong)func->n_inlines);
  pVVar3 = ctx->temp_string;
  sVar8 = strlen(local_68);
  if (pVVar3->varr == (char *)0x0) goto LAB_00143383;
  uVar9 = pVVar3->els_num + sVar8;
  if (pVVar3->size < uVar9) {
    unaff_R12 = (MIR_context_t)((uVar9 >> 1) + uVar9);
    pcVar10 = (char *)realloc(pVVar3->varr,(size_t)unaff_R12);
    pVVar3->varr = pcVar10;
    pVVar3->size = (size_t)unaff_R12;
  }
  if (sVar8 != 0) {
    sVar11 = 0;
    do {
      sVar4 = pVVar3->els_num;
      pVVar3->els_num = sVar4 + 1;
      pcVar10 = local_68 + sVar11;
      sVar11 = sVar11 + 1;
      pVVar3->varr[sVar4] = *pcVar10;
    } while (sVar8 != sVar11);
  }
  pMVar5 = vars->varr;
  if ((pMVar5 == (MIR_var_t *)0x0) || (vars->els_num <= uVar14)) goto LAB_0014337e;
  unaff_R12 = (MIR_context_t)pMVar5[uVar14].name;
  MVar2 = pMVar5[uVar14].type;
  pcVar10 = (char *)called_func->internal;
  type = MIR_T_I64;
  if ((MVar2 & ~MIR_T_U8) == MIR_T_F) {
    type = MVar2;
  }
  if (MVar2 == MIR_T_LD) {
    type = MVar2;
  }
  prVar12 = find_rd_by_name(unaff_R12,pcVar10,(MIR_func_t)(ulong)MVar2);
  if (prVar12 == (reg_desc_t *)0x0) goto LAB_00143388;
  reg = prVar12->reg;
  pVVar3 = ctx->temp_string;
  sVar8 = strlen((char *)unaff_R12);
  __ptr_00 = (MIR_context_t)pVVar3->varr;
  if (__ptr_00 == (MIR_context_t)0x0) goto LAB_0014339d;
  lVar16 = sVar8 + 1;
  uVar9 = pVVar3->els_num + lVar16;
  if (pVVar3->size < uVar9) {
    sVar8 = (uVar9 >> 1) + uVar9;
    pcVar10 = (char *)realloc(__ptr_00,sVar8);
    pVVar3->varr = pcVar10;
    pVVar3->size = sVar8;
  }
  if (lVar16 != 0) {
    lVar13 = 0;
    do {
      sVar4 = pVVar3->els_num;
      pVVar3->els_num = sVar4 + 1;
      pcVar10 = (char *)((long)&unaff_R12->gen_ctx + lVar13);
      lVar13 = lVar13 + 1;
      pVVar3->varr[sVar4] = *pcVar10;
    } while (lVar16 != lVar13);
  }
  pcVar10 = (char *)(ulong)reg;
  __ptr_00 = ctx;
  prVar12 = find_rd_by_reg(ctx,reg,called_func);
  hard_reg_name = prVar12->hard_reg_name;
  pVVar3 = ctx->temp_string;
  if (hard_reg_name != (char *)0x0) {
    if (pVVar3 != (VARR_char *)0x0) {
      name = pVVar3->varr;
      goto LAB_001432c9;
    }
    goto LAB_001433a7;
  }
  if (pVVar3 != (VARR_char *)0x0) {
    name = pVVar3->varr;
    hard_reg_name = (char *)0x0;
LAB_001432c9:
    pcVar10 = (char *)func;
    __ptr_00 = ctx;
    MVar7 = new_func_reg(ctx,func,type,name,hard_reg_name);
    psVar15 = ctx->simplify_ctx;
    do {
      pVVar6 = psVar15->inline_reg_map;
      if (pVVar6 == (VARR_MIR_reg_t *)0x0) {
        rename_regs_cold_4();
LAB_00143374:
        rename_regs_cold_2();
        goto LAB_00143379;
      }
      uVar9 = pVVar6->els_num;
      if (reg < uVar9) goto LAB_0014333b;
      __ptr = (MIR_context_t)pVVar6->varr;
      if (__ptr == (MIR_context_t)0x0) goto LAB_00143374;
      pcVar10 = (char *)(uVar9 + 1);
      if (pVVar6->size <= uVar9) {
        pcVar10 = (char *)((long)&((MIR_func_t)pcVar10)->name + ((ulong)pcVar10 >> 1));
        __ptr_00 = __ptr;
        __ptr = (MIR_context_t)realloc(__ptr,(long)pcVar10 * 4);
        pVVar6->varr = (MIR_reg_t *)__ptr;
        pVVar6->size = (size_t)pcVar10;
        uVar9 = pVVar6->els_num;
        psVar15 = ctx->simplify_ctx;
        pcVar10 = (char *)(uVar9 + 1);
      }
      pVVar6->els_num = (size_t)pcVar10;
      *(undefined4 *)((long)&__ptr->gen_ctx + uVar9 * 4) = 0;
    } while( true );
  }
  goto LAB_001433ac;
LAB_0014333b:
  if (pVVar6->varr == (MIR_reg_t *)0x0) {
LAB_001433a2:
    rename_regs_cold_3();
LAB_001433a7:
    rename_regs_cold_1();
LAB_001433ac:
    rename_regs_cold_5();
    if ((MIR_func_t)pcVar10 == (MIR_func_t)0x0) goto LAB_00143497;
    uVar14 = (ulong)(((MIR_func_t)pcVar10)->insns).head >> 0x20;
    if (uVar14 == 0) {
      return;
    }
    lVar16 = 0;
    goto LAB_001433d3;
  }
  pVVar6->varr[reg] = MVar7;
  uVar14 = uVar14 + 1;
  if (uVar14 == nvars) {
    return;
  }
  goto LAB_0014310b;
LAB_001433d3:
  cVar1 = *(char *)((long)&(((MIR_func_t)pcVar10)->original_insns).head + lVar16);
  if (cVar1 == '\n') {
    uVar9 = (ulong)*(uint *)((long)&((MIR_func_t)pcVar10)->last_temp_num + lVar16);
    if (uVar9 != 0) {
      pVVar6 = __ptr_00->simplify_ctx->inline_reg_map;
      if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
         (pVVar6->els_num <= uVar9)) goto LAB_0014348d;
      *(MIR_reg_t *)((long)&((MIR_func_t)pcVar10)->last_temp_num + lVar16) = pVVar6->varr[uVar9];
    }
    uVar9 = (ulong)*(uint *)((long)&((MIR_func_t)pcVar10)->n_inlines + lVar16);
    if (uVar9 != 0) {
      pVVar6 = __ptr_00->simplify_ctx->inline_reg_map;
      if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
         (pVVar6->els_num <= uVar9)) goto LAB_00143492;
      *(MIR_reg_t *)((long)&((MIR_func_t)pcVar10)->n_inlines + lVar16) = pVVar6->varr[uVar9];
    }
  }
  else if (cVar1 == '\x01') {
    pVVar6 = __ptr_00->simplify_ctx->inline_reg_map;
    if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
       (uVar9 = (ulong)*(uint *)((long)&(((MIR_func_t)pcVar10)->original_insns).tail + lVar16),
       pVVar6->els_num <= uVar9)) {
      change_inline_insn_regs_cold_3();
LAB_0014348d:
      change_inline_insn_regs_cold_1();
LAB_00143492:
      change_inline_insn_regs_cold_2();
LAB_00143497:
      __assert_fail("insn != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x816,"size_t MIR_insn_nops(MIR_context_t, MIR_insn_t)");
    }
    *(MIR_reg_t *)((long)&(((MIR_func_t)pcVar10)->original_insns).tail + lVar16) =
         pVVar6->varr[uVar9];
  }
  lVar16 = lVar16 + 0x30;
  if (uVar14 * 0x30 == lVar16) {
    return;
  }
  goto LAB_001433d3;
}

Assistant:

static void rename_regs (MIR_context_t ctx, MIR_func_t func, MIR_func_t called_func,
                         VARR (MIR_var_t) * vars, size_t nvars) {
  char buff[50];
  const char *hard_reg_name;
  MIR_var_t var;
  MIR_type_t type;
  MIR_reg_t old_reg, new_reg;

  if (vars == NULL) return;
  for (size_t i = 0; i < nvars; i++) {
    VARR_TRUNC (char, temp_string, 0);
    sprintf (buff, ".c%d_", func->n_inlines);
    VARR_PUSH_ARR (char, temp_string, buff, strlen (buff));
    var = VARR_GET (MIR_var_t, vars, i);
    type
      = (var.type == MIR_T_F || var.type == MIR_T_D || var.type == MIR_T_LD ? var.type : MIR_T_I64);
    old_reg = MIR_reg (ctx, var.name, called_func);
    VARR_PUSH_ARR (char, temp_string, var.name, strlen (var.name) + 1);
    if ((hard_reg_name = MIR_reg_hard_reg_name (ctx, old_reg, called_func)) != NULL) {
      new_reg
        = MIR_new_global_func_reg (ctx, func, type, VARR_ADDR (char, temp_string), hard_reg_name);
    } else {
      new_reg = MIR_new_func_reg (ctx, func, type, VARR_ADDR (char, temp_string));
    }
    set_inline_reg_map (ctx, old_reg, new_reg);
  }
}